

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t get_xfer_size(tree *t,wchar_t fd,char *path)

{
  int *piVar1;
  long lVar2;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 local_4;
  
  *(undefined8 *)(*(long *)(in_RDI + 0x1f8) + 0x38) = 0xffffffffffffffff;
  piVar1 = __errno_location();
  *piVar1 = 0;
  if (in_ESI < 0) {
    if (in_RDX != (char *)0x0) {
      lVar2 = pathconf(in_RDX,0xe);
      *(long *)(*(long *)(in_RDI + 0x1f8) + 0x20) = lVar2;
      lVar2 = pathconf(in_RDX,0xf);
      *(long *)(*(long *)(in_RDI + 0x1f8) + 0x28) = lVar2;
      lVar2 = pathconf(in_RDX,0x10);
      *(long *)(*(long *)(in_RDI + 0x1f8) + 0x30) = lVar2;
      lVar2 = pathconf(in_RDX,0x11);
      *(long *)(*(long *)(in_RDI + 0x1f8) + 0x38) = lVar2;
    }
  }
  else {
    lVar2 = fpathconf(in_ESI,0xe);
    *(long *)(*(long *)(in_RDI + 0x1f8) + 0x20) = lVar2;
    lVar2 = fpathconf(in_ESI,0xf);
    *(long *)(*(long *)(in_RDI + 0x1f8) + 0x28) = lVar2;
    lVar2 = fpathconf(in_ESI,0x10);
    *(long *)(*(long *)(in_RDI + 0x1f8) + 0x30) = lVar2;
    lVar2 = fpathconf(in_ESI,0x11);
    *(long *)(*(long *)(in_RDI + 0x1f8) + 0x38) = lVar2;
  }
  if (*(long *)(*(long *)(in_RDI + 0x1f8) + 0x38) == -1) {
    piVar1 = __errno_location();
    local_4 = L'\xffffffff';
    if (*piVar1 == 0x16) {
      local_4 = L'\x01';
    }
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
get_xfer_size(struct tree *t, int fd, const char *path)
{
	t->current_filesystem->xfer_align = -1;
	errno = 0;
	if (fd >= 0) {
		t->current_filesystem->incr_xfer_size =
		    fpathconf(fd, _PC_REC_INCR_XFER_SIZE);
		t->current_filesystem->max_xfer_size =
		    fpathconf(fd, _PC_REC_MAX_XFER_SIZE);
		t->current_filesystem->min_xfer_size =
		    fpathconf(fd, _PC_REC_MIN_XFER_SIZE);
		t->current_filesystem->xfer_align =
		    fpathconf(fd, _PC_REC_XFER_ALIGN);
	} else if (path != NULL) {
		t->current_filesystem->incr_xfer_size =
		    pathconf(path, _PC_REC_INCR_XFER_SIZE);
		t->current_filesystem->max_xfer_size =
		    pathconf(path, _PC_REC_MAX_XFER_SIZE);
		t->current_filesystem->min_xfer_size =
		    pathconf(path, _PC_REC_MIN_XFER_SIZE);
		t->current_filesystem->xfer_align =
		    pathconf(path, _PC_REC_XFER_ALIGN);
	}
	/* At least we need an alignment size. */
	if (t->current_filesystem->xfer_align == -1)
		return ((errno == EINVAL)?1:-1);
	else
		return (0);
}